

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t exr_attr_chlist_destroy(exr_context_t ctxt,exr_attr_chlist_t *clist)

{
  int iVar1;
  int *in_RSI;
  long in_RDI;
  int i;
  exr_attr_chlist_entry_t *entries;
  int nc;
  exr_attr_chlist_t nil;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  exr_context_t ctxt_00;
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (int *)0x0) {
      local_18 = in_RSI;
      local_10 = in_RDI;
      memset(&local_28,0,0x10);
      iVar1 = *local_18;
      ctxt_00 = *(exr_context_t *)(local_18 + 2);
      for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        exr_attr_string_destroy
                  (ctxt_00,(exr_attr_string_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
      }
      if (ctxt_00 != (exr_context_t)0x0) {
        (**(code **)(local_10 + 0x60))(ctxt_00);
      }
      *(undefined8 *)local_18 = local_28;
      *(undefined8 *)(local_18 + 2) = local_20;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_chlist_destroy (exr_context_t ctxt, exr_attr_chlist_t* clist)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (clist)
    {
        exr_attr_chlist_t        nil = {0};
        int                      nc  = clist->num_channels;
        exr_attr_chlist_entry_t* entries =
            EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

        for (int i = 0; i < nc; ++i)
            exr_attr_string_destroy (ctxt, &(entries[i].name));
        if (entries) ctxt->free_fn (entries);
        *clist = nil;
    }
    return EXR_ERR_SUCCESS;
}